

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceVkImpl::CreateTexture
          (RenderDeviceVkImpl *this,TextureDesc *TexDesc,VkImage vkImgHandle,
          RESOURCE_STATE InitialState,TextureVkImpl **ppTexture)

{
  TextureVkImpl *this_00;
  RESOURCE_STATE InitialState_local;
  string ObjectDescString;
  string msg;
  VkImage vkImgHandle_local;
  RenderDeviceVkImpl *local_28;
  
  InitialState_local = InitialState;
  vkImgHandle_local = vkImgHandle;
  if (ppTexture == (TextureVkImpl **)0x0) {
    FormatString<char[22]>(&msg,(char (*) [22])"Null pointer provided");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x1b1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (*ppTexture != (TextureVkImpl *)0x0) {
      FormatString<char[64]>
                (&msg,(char (*) [64])
                      "Overwriting reference to existing object may cause memory leaks");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateDeviceObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0x1b5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    *ppTexture = (TextureVkImpl *)0x0;
    msg._M_dataplus._M_p =
         (pointer)&(this->
                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TexObjAllocator;
    msg._M_string_length = 0;
    msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_325beb;
    msg.field_2._8_8_ = anon_var_dwarf_311388;
    local_28 = this;
    this_00 = MakeNewRCObj<Diligent::TextureVkImpl,Diligent::FixedBlockMemoryAllocator>::operator()
                        ((MakeNewRCObj<Diligent::TextureVkImpl,Diligent::FixedBlockMemoryAllocator>
                          *)&msg,&(this->
                                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                                  m_TexViewObjAllocator,&local_28,TexDesc,&InitialState_local,
                         &vkImgHandle_local);
    TextureVkImpl::QueryInterface(this_00,(INTERFACE_ID *)IID_TextureVk,(IObject **)ppTexture);
  }
  return;
}

Assistant:

void RenderDeviceVkImpl::CreateTexture(const TextureDesc& TexDesc, VkImage vkImgHandle, RESOURCE_STATE InitialState, class TextureVkImpl** ppTexture)
{
    CreateDeviceObject(
        "texture", TexDesc, ppTexture,
        [&]() //
        {
            TextureVkImpl* pTextureVk = NEW_RC_OBJ(m_TexObjAllocator, "TextureVkImpl instance", TextureVkImpl)(m_TexViewObjAllocator, this, TexDesc, InitialState, std::move(vkImgHandle));
            pTextureVk->QueryInterface(IID_TextureVk, reinterpret_cast<IObject**>(ppTexture));
        } //
    );
}